

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_4,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  Type in1;
  Matrix<float,_4,_4> res;
  float afStack_100 [6];
  float local_e8 [4];
  float local_d8 [2];
  ulong uStack_d0;
  float local_c8 [14];
  float local_90 [4];
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  float local_64;
  Matrix<float,_4,_4> retVal;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar6 = (evalCtx->coords).m_data[0];
    fVar7 = (evalCtx->coords).m_data[1];
    fVar8 = (evalCtx->coords).m_data[2];
    fVar9 = (evalCtx->coords).m_data[3];
  }
  else {
    fVar6 = 1.4;
    fVar7 = 0.2;
    fVar8 = -0.5;
    fVar9 = 0.7;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    retVal.m_data.m_data[0].m_data[2] = (evalCtx->coords).m_data[0];
    retVal.m_data.m_data[0].m_data[3] = (evalCtx->coords).m_data[1];
    retVal.m_data.m_data[1].m_data[0] = (evalCtx->coords).m_data[2];
    retVal.m_data.m_data[1].m_data[1] = (evalCtx->coords).m_data[3];
  }
  else {
    retVal.m_data.m_data[0].m_data[2] = (float)0x3e4ccccd;
    retVal.m_data.m_data[0].m_data[3] = (float)0xbf800000;
    retVal.m_data.m_data[1].m_data[0] = (float)0x3f000000;
    retVal.m_data.m_data[1].m_data[1] = (float)0x3f4ccccd;
  }
  pfVar2 = local_d8;
  local_c8[8] = 0.0;
  local_c8[9] = 0.0;
  local_c8[10] = 0.0;
  local_c8[0xb] = 0.0;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  uStack_d0 = 0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar5) = uVar10;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while (lVar4 != 4);
  lVar3 = 0;
  do {
    fVar1 = retVal.m_data.m_data[0].m_data[lVar3 + 2];
    local_d8[lVar3] = fVar1 * fVar6;
    local_c8[lVar3] = fVar1 * fVar7;
    local_c8[lVar3 + 4] = fVar1 * fVar8;
    local_c8[lVar3 + 8] = fVar1 * fVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pfVar2 = retVal.m_data.m_data[1].m_data + 2;
  retVal.m_data.m_data[3].m_data[2] = 0.0;
  retVal.m_data.m_data[3].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[3] = 0.0;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uVar10 = 0x3f800000;
      if (lVar3 != lVar5) {
        uVar10 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar5) = uVar10;
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x40);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while (lVar4 != 4);
  lVar3 = 0;
  do {
    fVar6 = *(float *)((long)local_c8 + lVar3);
    fVar7 = *(float *)((long)local_c8 + lVar3 + 0x10);
    fVar8 = *(float *)((long)local_c8 + lVar3 + 0x20);
    retVal.m_data.m_data[1].m_data[lVar3 + 2] = *(float *)((long)local_d8 + lVar3);
    retVal.m_data.m_data[1].m_data[lVar3 + 3] = fVar6;
    retVal.m_data.m_data[2].m_data[lVar3] = fVar7;
    retVal.m_data.m_data[2].m_data[lVar3 + 1] = fVar8;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  res_1.m_data[0] = retVal.m_data.m_data[1].m_data[2];
  res_1.m_data[1] = retVal.m_data.m_data[1].m_data[3];
  res_1.m_data[2] = retVal.m_data.m_data[2].m_data[0];
  res_3.m_data[0] = retVal.m_data.m_data[2].m_data[3];
  res_3.m_data[1] = retVal.m_data.m_data[3].m_data[0];
  res_3.m_data[2] = retVal.m_data.m_data[3].m_data[1];
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar3 = 0;
  do {
    local_e8[lVar3] = res_1.m_data[lVar3] + res_3.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_90[0] = 0.0;
  local_90[1] = 0.0;
  local_90[2] = retVal.m_data.m_data[3].m_data[2];
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  uStack_d0 = uStack_d0 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    local_d8[lVar3] = local_e8[lVar3] + local_90[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  afStack_100[2] = 0.0;
  afStack_100[3] = 0.0;
  afStack_100[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_100[lVar3 + 2] = local_d8[lVar3] + retVal.m_data.m_data[0].m_data[lVar3 + -1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  uStack_d0 = 0x100000000;
  local_c8[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_d8[lVar3]] = afStack_100[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}